

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.c
# Opt level: O0

int32_t intersect_vector16(uint16_t *A,size_t s_a,uint16_t *B,size_t s_b,uint16_t *C)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  long in_R8;
  bool bVar9;
  int r;
  __m128i res_v;
  __m128i v_b;
  __m128i v_a;
  size_t st_b;
  size_t st_a;
  int vectorlength;
  size_t i_b;
  size_t i_a;
  size_t count;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  int local_1a8;
  undefined8 local_188;
  undefined8 uStack_180;
  int local_158;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  ulong local_108;
  ulong local_100;
  long local_f8;
  uint16_t b;
  uint16_t a;
  uint16_t b_max_1;
  uint16_t a_max_1;
  __m128i p_1;
  __m128i sm16_1;
  int r_1;
  __m128i res_v_1;
  uint16_t b_max;
  uint16_t a_max;
  __m128i p;
  __m128i sm16;
  
  local_f8 = 0;
  local_100 = 0;
  local_108 = 0;
  uVar4 = in_RSI & 0xfffffffffffffff8;
  uVar5 = in_RCX & 0xfffffffffffffff8;
  uVar8 = local_108;
  uVar7 = local_100;
  if ((uVar4 != 0) && (uVar5 != 0)) {
    local_138 = vlddqu_avx(*in_RDI);
    local_148 = vlddqu_avx(*in_RDX);
LAB_001154d3:
    bVar9 = true;
    if (*(short *)(*in_RDI + local_100 * 2) != 0) {
      bVar9 = *(short *)(*in_RDX + local_108 * 2) == 0;
    }
    uVar8 = local_108;
    uVar7 = local_100;
    if (!bVar9) goto LAB_001156f6;
    vpcmpestrm_avx(local_148,local_138,1);
    local_158 = local_148._0_4_;
    auVar2 = vpshufb_avx(local_138,*(undefined1 (*) [16])(shuffle_mask16 + (long)local_158 * 0x10));
    puVar6 = (undefined8 *)(in_R8 + local_f8 * 2);
    local_188 = auVar2._0_8_;
    uStack_180 = auVar2._8_8_;
    *puVar6 = local_188;
    puVar6[1] = uStack_180;
    local_f8 = POPCOUNT(local_158) + local_f8;
    lVar3 = local_100 * 2;
    if (*(ushort *)(*in_RDI + lVar3 + 0xe) <= *(ushort *)(*in_RDX + local_108 * 2 + 0xe)) {
      uVar7 = local_100 + 8;
      if (uVar7 == uVar4) goto LAB_001156f6;
      local_138 = vlddqu_avx(*(undefined1 (*) [16])(in_RDI[1] + local_100 * 2));
      local_100 = uVar7;
    }
    if (*(ushort *)(*in_RDX + local_108 * 2 + 0xe) <= *(ushort *)(*in_RDI + lVar3 + 0xe)) {
      uVar8 = local_108 + 8;
      uVar7 = local_100;
      if (uVar8 == uVar5) goto LAB_001156f6;
      local_148 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX[1] + local_108 * 2));
      local_108 = uVar8;
    }
    goto LAB_001154d3;
  }
  goto LAB_001158f6;
LAB_001156f6:
  local_100 = uVar7;
  local_108 = uVar8;
  uVar8 = local_108;
  uVar7 = local_100;
  if ((local_100 < uVar4) && (local_108 < uVar5)) {
LAB_00115718:
    vpcmpistrm_avx(local_148,local_138,1);
    local_1a8 = local_148._0_4_;
    auVar2 = vpshufb_avx(local_138,*(undefined1 (*) [16])(shuffle_mask16 + (long)local_1a8 * 0x10));
    puVar6 = (undefined8 *)(in_R8 + local_f8 * 2);
    local_1d8 = auVar2._0_8_;
    uStack_1d0 = auVar2._8_8_;
    *puVar6 = local_1d8;
    puVar6[1] = uStack_1d0;
    local_f8 = POPCOUNT(local_1a8) + local_f8;
    lVar3 = local_100 * 2;
    if (*(ushort *)(*in_RDI + lVar3 + 0xe) <= *(ushort *)(*in_RDX + local_108 * 2 + 0xe)) {
      uVar7 = local_100 + 8;
      uVar8 = local_108;
      if (uVar7 == uVar4) goto LAB_001158f6;
      local_138 = vlddqu_avx(*(undefined1 (*) [16])(in_RDI[1] + local_100 * 2));
      local_100 = uVar7;
    }
    if (*(ushort *)(*in_RDX + local_108 * 2 + 0xe) <= *(ushort *)(*in_RDI + lVar3 + 0xe)) {
      uVar8 = local_108 + 8;
      uVar7 = local_100;
      if (uVar8 == uVar5) goto LAB_001158f6;
      local_148 = vlddqu_avx(*(undefined1 (*) [16])(in_RDX[1] + local_108 * 2));
      local_108 = uVar8;
    }
    goto LAB_00115718;
  }
LAB_001158f6:
  while (local_100 = uVar7, local_108 = uVar8, local_100 < in_RSI && local_108 < in_RCX) {
    uVar1 = *(ushort *)(*in_RDI + local_100 * 2);
    if (uVar1 < *(ushort *)(*in_RDX + local_108 * 2)) {
      uVar8 = local_108;
      uVar7 = local_100 + 1;
    }
    else {
      if (uVar1 <= *(ushort *)(*in_RDX + local_108 * 2)) {
        *(ushort *)(in_R8 + local_f8 * 2) = uVar1;
        local_f8 = local_f8 + 1;
        local_100 = local_100 + 1;
      }
      local_108 = local_108 + 1;
      uVar8 = local_108;
      uVar7 = local_100;
    }
  }
  return (int32_t)local_f8;
}

Assistant:

CROARING_TARGET_AVX2
int32_t intersect_vector16(const uint16_t *__restrict__ A, size_t s_a,
                           const uint16_t *__restrict__ B, size_t s_b,
                           uint16_t *C) {
    size_t count = 0;
    size_t i_a = 0, i_b = 0;
    const int vectorlength = sizeof(__m128i) / sizeof(uint16_t);
    const size_t st_a = (s_a / vectorlength) * vectorlength;
    const size_t st_b = (s_b / vectorlength) * vectorlength;
    __m128i v_a, v_b;
    if ((i_a < st_a) && (i_b < st_b)) {
        v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
        v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
        while ((A[i_a] == 0) || (B[i_b] == 0)) {
            const __m128i res_v = _mm_cmpestrm(
                v_b, vectorlength, v_a, vectorlength,
                _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
            const int r = _mm_extract_epi32(res_v, 0);
            __m128i sm16 = _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
            __m128i p = _mm_shuffle_epi8(v_a, sm16);
            _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
            count += _mm_popcnt_u32(r);
            const uint16_t a_max = A[i_a + vectorlength - 1];
            const uint16_t b_max = B[i_b + vectorlength - 1];
            if (a_max <= b_max) {
                i_a += vectorlength;
                if (i_a == st_a) break;
                v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
            }
            if (b_max <= a_max) {
                i_b += vectorlength;
                if (i_b == st_b) break;
                v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
            }
        }
        if ((i_a < st_a) && (i_b < st_b))
            while (true) {
                const __m128i res_v = _mm_cmpistrm(
                    v_b, v_a,
                    _SIDD_UWORD_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
                const int r = _mm_extract_epi32(res_v, 0);
                __m128i sm16 =
                    _mm_loadu_si128((const __m128i *)shuffle_mask16 + r);
                __m128i p = _mm_shuffle_epi8(v_a, sm16);
                _mm_storeu_si128((__m128i *)&C[count], p);  // can overflow
                count += _mm_popcnt_u32(r);
                const uint16_t a_max = A[i_a + vectorlength - 1];
                const uint16_t b_max = B[i_b + vectorlength - 1];
                if (a_max <= b_max) {
                    i_a += vectorlength;
                    if (i_a == st_a) break;
                    v_a = _mm_lddqu_si128((__m128i *)&A[i_a]);
                }
                if (b_max <= a_max) {
                    i_b += vectorlength;
                    if (i_b == st_b) break;
                    v_b = _mm_lddqu_si128((__m128i *)&B[i_b]);
                }
            }
    }
    // intersect the tail using scalar intersection
    while (i_a < s_a && i_b < s_b) {
        uint16_t a = A[i_a];
        uint16_t b = B[i_b];
        if (a < b) {
            i_a++;
        } else if (b < a) {
            i_b++;
        } else {
            C[count] = a;  //==b;
            count++;
            i_a++;
            i_b++;
        }
    }
    return (int32_t)count;
}